

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGate1.hpp
# Opt level: O0

bool __thiscall
qclab::qgates::PointerGate1<std::complex<float>_>::equals
          (PointerGate1<std::complex<float>_> *this,QObject<std::complex<float>_> *other)

{
  QGate1<std::complex<float>_> *pQVar1;
  QGate1<std::complex<float>_> *other_00;
  PointerGate1<std::complex<float>_> *local_40;
  G *p;
  QObject<std::complex<float>_> *other_local;
  PointerGate1<std::complex<float>_> *this_local;
  
  if (other == (QObject<std::complex<float>_> *)0x0) {
    local_40 = (PointerGate1<std::complex<float>_> *)0x0;
  }
  else {
    local_40 = (PointerGate1<std::complex<float>_> *)
               __dynamic_cast(other,&QObject<std::complex<float>>::typeinfo,
                              &PointerGate1<std::complex<float>>::typeinfo,0);
  }
  if (local_40 == (PointerGate1<std::complex<float>_> *)0x0) {
    pQVar1 = ptr(this);
    this_local._7_1_ =
         QObject<std::complex<float>_>::operator==
                   (other,&pQVar1->super_QObject<std::complex<float>_>);
  }
  else {
    pQVar1 = ptr(local_40);
    other_00 = ptr(this);
    this_local._7_1_ =
         QObject<std::complex<float>_>::operator==
                   (&pQVar1->super_QObject<std::complex<float>_>,
                    &other_00->super_QObject<std::complex<float>_>);
  }
  return this_local._7_1_;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
          using G = PointerGate1< T > ;
          if ( const G* p = dynamic_cast< const G* >( &other ) ) {
            return *p->ptr() == *this->ptr() ;
          }
          return other == *this->ptr() ;
        }